

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O0

int __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>_>
::access(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>_>
         *this,char *__name,int __type)

{
  ushort uVar1;
  bool bVar2;
  int extraout_EAX;
  uint uVar3;
  uint uVar4;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  ulong uVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  bool bVar6;
  byte local_21;
  bool alternative_zero_page;
  bool is_read_local;
  uint16_t address_local;
  AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>_>
  *this_local;
  
  uVar1 = (ushort)__name;
  if ((0xc2ff < uVar1) && (uVar1 < 0xd000)) {
    local_21 = 0;
    if ((int)(uint)uVar1 >> 8 == 0xc3) {
      local_21 = (this->switches_).slot_C3_rom ^ 0xff;
    }
    (this->switches_).internal_C8_rom =
         ((this->switches_).internal_C8_rom & 1U) != 0 || (local_21 & 1) != 0;
    (this->switches_).internal_C8_rom =
         ((this->switches_).internal_C8_rom & 1U & uVar1 != 0xcfff) != 0;
    set_card_paging(this);
    return extraout_EAX;
  }
  if ((uVar1 < 0xc000) || (0xc057 < uVar1)) {
    return (uint)uVar1;
  }
  uVar3 = uVar1 - 0xc000;
  uVar4 = uVar1 - 0xc057;
  uVar5 = (ulong)uVar4;
  if (uVar3 < 0x57 || uVar4 == 0) {
    uVar5 = (long)&switchD_004efa9a::switchdataD_00a35c78 +
            (long)(int)(&switchD_004efa9a::switchdataD_00a35c78)[uVar3];
    switch(uVar5) {
    case 0x4efa9c:
      goto switchD_004efa9a_caseD_c00c;
    case 0x4efaa1:
      if ((__type & 1U) == 0) {
        (this->switches_).store_80 = ((ulong)__name & 1) != 0;
        set_main_paging(this);
        uVar5 = extraout_RAX;
      }
      uVar3 = (uint)uVar5;
      break;
    case 0x4efac7:
      if ((__type & 1U) == 0) {
        (this->switches_).read_auxiliary_memory = ((ulong)__name & 1) != 0;
        set_main_paging(this);
        uVar5 = extraout_RAX_00;
      }
      uVar3 = (uint)uVar5;
      break;
    case 0x4efaed:
      if ((__type & 1U) == 0) {
        (this->switches_).write_auxiliary_memory = ((ulong)__name & 1) != 0;
        set_main_paging(this);
        uVar5 = extraout_RAX_01;
      }
      uVar3 = (uint)uVar5;
      break;
    case 0x4efb13:
      if ((__type & 1U) == 0) {
        (this->switches_).internal_CX_rom = ((ulong)__name & 1) != 0;
        set_card_paging(this);
        uVar5 = extraout_RAX_02;
      }
      uVar3 = (uint)uVar5;
      break;
    case 0x4efb39:
      bVar6 = ((ulong)__name & 1) != 0;
      uVar3 = (uint)bVar6;
      if (((__type & 1U) == 0) &&
         (bVar2 = (bool)((this->switches_).alternative_zero_page & 1), uVar3 = (uint)bVar2,
         bVar2 != bVar6)) {
        (this->switches_).alternative_zero_page = bVar6;
        set_zero_page_paging(this);
        uVar3 = extraout_EAX_00;
      }
      break;
    case 0x4efb7d:
      if ((__type & 1U) == 0) {
        (this->switches_).slot_C3_rom = ((ulong)__name & 1) != 0;
        set_card_paging(this);
        uVar5 = extraout_RAX_03;
      }
      uVar3 = (uint)uVar5;
      break;
    case 0x4efba0:
      (this->switches_).video_page_2 = ((ulong)__name & 1) != 0;
      set_main_paging(this);
      uVar3 = extraout_EAX_01;
      break;
    case 0x4efbbd:
      (this->switches_).high_resolution = ((ulong)__name & 1) != 0;
      set_main_paging(this);
      uVar3 = extraout_EAX_02;
    }
  }
  else {
switchD_004efa9a_caseD_c00c:
    uVar3 = (uint)uVar5;
  }
  return uVar3;
}

Assistant:

void access(uint16_t address, bool is_read) {
			if(address >= 0xc300 && address < 0xd000) {
				switches_.internal_C8_rom |= ((address >> 8) == 0xc3) && !switches_.slot_C3_rom;
				switches_.internal_C8_rom &= (address != 0xcfff);
				set_card_paging();
				return;
			}

			if(address < 0xc000 || address >= 0xc058) return;

			switch(address) {
				default: break;

				case 0xc000: case 0xc001:
					if(!is_read) {
						switches_.store_80 = address & 1;
						set_main_paging();
					}
				break;

				case 0xc002: case 0xc003:
					if(!is_read) {
						switches_.read_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc004: case 0xc005:
					if(!is_read) {
						switches_.write_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc006: case 0xc007:
					if(!is_read) {
						switches_.internal_CX_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc008: case 0xc009: {
					const bool alternative_zero_page = address & 1;
					if(!is_read && switches_.alternative_zero_page != alternative_zero_page) {
						switches_.alternative_zero_page = alternative_zero_page;
						set_zero_page_paging();
					}
				} break;

				case 0xc00a: case 0xc00b:
					if(!is_read) {
						switches_.slot_C3_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc054: case 0xc055:
					switches_.video_page_2 = address & 1;
					set_main_paging();
				break;

				case 0xc056: case 0xc057:
					switches_.high_resolution = address & 1;
					set_main_paging();
				break;
			}
		}